

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIRMIA3.h
# Opt level: O1

int ConnectLIRMIA3(LIRMIA3 *pLIRMIA3,char *szCfgFilePath)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  FILE *__stream;
  char *pcVar6;
  char line [256];
  char local_138;
  char local_137;
  
  memset(pLIRMIA3->szCfgFilePath,0,0x100);
  sprintf(pLIRMIA3->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar4 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar4 != 0) {
    memset(&local_138,0,0x100);
    memset(pLIRMIA3->szDevPath + 5,0,0xfb);
    builtin_strncpy(pLIRMIA3->szDevPath,"COM1",5);
    pLIRMIA3->BaudRate = 0x1c200;
    pLIRMIA3->timeout = 1000;
    pLIRMIA3->threadperiod = 0x32;
    pLIRMIA3->bSaveRawData = 1;
    lVar5 = -0x10;
    do {
      *(undefined4 *)((long)pLIRMIA3->MidPWs + lVar5) = 1000;
      *(undefined4 *)((long)pLIRMIA3->MaxPWs + lVar5) = 0x5dc;
      *(undefined4 *)((long)pLIRMIA3->InitPWs + lVar5) = 2000;
      *(undefined4 *)((long)pLIRMIA3->ThresholdPWs + lVar5) = 0x5dc;
      *(undefined4 *)((long)pLIRMIA3->CoefPWs + lVar5) = 0;
      *(undefined8 *)((long)pLIRMIA3->bProportionalPWs + lVar5 * 2) = 0x3ff0000000000000;
      *(undefined4 *)((long)pLIRMIA3->bProportionalPWs + lVar5 + 0x10) = 1;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0);
    pLIRMIA3->rightthrusterchan = 3;
    pLIRMIA3->leftthrusterchan = 2;
    pLIRMIA3->frontthrusterchan = 0;
    pLIRMIA3->rearthrusterchan = 1;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar6 = "Configuration file not found.";
    }
    else {
      do {
        while ((pcVar6 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if ((local_138 != '/') || ((pcVar6 == (char *)0x0 || (local_137 != '/'))))
          goto LAB_001c6862;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001c6862:
      if (pcVar6 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_138,"%255s",pLIRMIA3->szDevPath);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if ((local_138 != '/') || ((pcVar6 == (char *)0x0 || (local_137 != '/'))))
          goto LAB_001c68e1;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001c68e1:
      if (pcVar6 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_138,"%d",&pLIRMIA3->BaudRate);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if ((local_138 != '/') || ((pcVar6 == (char *)0x0 || (local_137 != '/'))))
          goto LAB_001c6960;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001c6960:
      if (pcVar6 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_138,"%d",&pLIRMIA3->timeout);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if ((local_138 != '/') || ((pcVar6 == (char *)0x0 || (local_137 != '/'))))
          goto LAB_001c69e1;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001c69e1:
      if (pcVar6 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_138,"%d",&pLIRMIA3->threadperiod);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if ((local_138 != '/') || ((pcVar6 == (char *)0x0 || (local_137 != '/'))))
          goto LAB_001c6a62;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001c6a62:
      if (pcVar6 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_138,"%d",&pLIRMIA3->bSaveRawData);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      lVar5 = 0;
LAB_001c6b0e:
      do {
        pcVar6 = fgets(&local_138,0x100,__stream);
        if ((local_138 == '#') || (local_138 == '%')) {
          if (pcVar6 != (char *)0x0) goto LAB_001c6b0e;
        }
        else if (((local_138 == '/') && (pcVar6 != (char *)0x0)) && (local_137 == '/'))
        goto LAB_001c6b0e;
        if (pcVar6 == (char *)0x0 || local_138 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_138,"%d",pLIRMIA3->MinPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%'))
                ) {
            if ((local_138 != '/') || ((pcVar6 == (char *)0x0 || (local_137 != '/'))))
            goto LAB_001c6bb7;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001c6bb7:
        if (pcVar6 == (char *)0x0 || local_138 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_138,"%d",pLIRMIA3->MidPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%'))
                ) {
            if ((local_138 != '/') || ((pcVar6 == (char *)0x0 || (local_137 != '/'))))
            goto LAB_001c6c29;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001c6c29:
        if (pcVar6 == (char *)0x0 || local_138 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_138,"%d",pLIRMIA3->MaxPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%'))
                ) {
            if ((local_138 != '/') || ((pcVar6 == (char *)0x0 || (local_137 != '/'))))
            goto LAB_001c6c9b;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001c6c9b:
        if (pcVar6 == (char *)0x0 || local_138 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_138,"%d",pLIRMIA3->InitPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%'))
                ) {
            if ((local_138 != '/') || ((pcVar6 == (char *)0x0 || (local_137 != '/'))))
            goto LAB_001c6d0d;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001c6d0d:
        if (pcVar6 == (char *)0x0 || local_138 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_138,"%d",pLIRMIA3->ThresholdPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%'))
                ) {
            if ((local_138 != '/') || ((pcVar6 == (char *)0x0 || (local_137 != '/'))))
            goto LAB_001c6d7f;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001c6d7f:
        if (pcVar6 == (char *)0x0 || local_138 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_138,"%lf",pLIRMIA3->CoefPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        do {
          while ((pcVar6 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%'))
                ) {
            if ((local_138 != '/') || ((pcVar6 == (char *)0x0 || (local_137 != '/'))))
            goto LAB_001c6df5;
          }
        } while (pcVar6 != (char *)0x0);
LAB_001c6df5:
        if (pcVar6 == (char *)0x0 || local_138 == '$') {
          puts("Invalid configuration file.");
        }
        iVar4 = __isoc99_sscanf(&local_138,"%d",pLIRMIA3->bProportionalPWs + lVar5);
        if (iVar4 != 1) {
          puts("Invalid configuration file.");
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      do {
        while ((pcVar6 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if ((local_138 != '/') || ((pcVar6 == (char *)0x0 || (local_137 != '/'))))
          goto LAB_001c6e83;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001c6e83:
      if (pcVar6 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_138,"%d",&pLIRMIA3->rightthrusterchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if ((local_138 != '/') || ((pcVar6 == (char *)0x0 || (local_137 != '/'))))
          goto LAB_001c6f04;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001c6f04:
      if (pcVar6 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_138,"%d",&pLIRMIA3->leftthrusterchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if ((local_138 != '/') || ((pcVar6 == (char *)0x0 || (local_137 != '/'))))
          goto LAB_001c6f85;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001c6f85:
      if (pcVar6 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_138,"%d",&pLIRMIA3->frontthrusterchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar6 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if ((local_138 != '/') || ((pcVar6 == (char *)0x0 || (local_137 != '/'))))
          goto LAB_001c7006;
        }
      } while (pcVar6 != (char *)0x0);
LAB_001c7006:
      if (pcVar6 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar4 = __isoc99_sscanf(&local_138,"%d",&pLIRMIA3->rearthrusterchan);
      if (iVar4 != 1) {
        puts("Invalid configuration file.");
      }
      iVar4 = fclose(__stream);
      if (iVar4 == 0) goto LAB_001c706c;
      pcVar6 = "fclose() failed.";
    }
    puts(pcVar6);
  }
LAB_001c706c:
  if (pLIRMIA3->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pLIRMIA3->threadperiod = 0x32;
  }
  lVar5 = 0x150;
  do {
    iVar4 = *(int *)((pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + -0x10);
    if (((iVar4 - 0x9c5U < 0xfffff82f) ||
        (iVar1 = *(int *)((pLIRMIA3->RS232Port).szDevPath + lVar5 * 4), iVar1 - 0x9c5U < 0xfffff82f)
        ) || (iVar2 = *(int *)((pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + 0x10),
             iVar2 - 0x9c5U < 0xfffff82f)) {
LAB_001c70d5:
      printf("Invalid parameters : channel %d.\n",(ulong)((int)lVar5 - 0x150));
      pcVar6 = (pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + -0x10;
      pcVar6[0] = -0x18;
      pcVar6[1] = '\x03';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6 = (pLIRMIA3->RS232Port).szDevPath + lVar5 * 4;
      pcVar6[0] = -0x24;
      pcVar6[1] = '\x05';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6 = (pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + 0x10;
      pcVar6[0] = -0x30;
      pcVar6[1] = '\a';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6 = (pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + 0x20;
      pcVar6[0] = -0x24;
      pcVar6[1] = '\x05';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6 = (pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + 0x30;
      pcVar6[0] = '\0';
      pcVar6[1] = '\0';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      *(undefined8 *)((long)pLIRMIA3 + lVar5 * 8 + -0x4f0) = 0x3ff0000000000000;
      pcVar6 = (pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + 0x60;
      pcVar6[0] = '\x01';
      pcVar6[1] = '\0';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
    }
    else {
      iVar3 = *(int *)((pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + 0x20);
      if (iVar3 != 0) {
        if (((iVar1 <= iVar2) && (iVar4 <= iVar1)) &&
           ((iVar3 <= iVar2 && ((iVar4 <= iVar3 && (0xfffff82e < iVar3 - 0x9c5U))))))
        goto LAB_001c716b;
        goto LAB_001c70d5;
      }
      if (iVar2 < iVar1 || iVar1 < iVar4) goto LAB_001c70d5;
LAB_001c716b:
      if (*(int *)((pLIRMIA3->RS232Port).szDevPath + lVar5 * 4 + 0x30) < 0) goto LAB_001c70d5;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x154);
  if (3 < (uint)pLIRMIA3->rightthrusterchan) {
    puts("Invalid parameter : rightthrusterchan.");
    pLIRMIA3->rightthrusterchan = 1;
  }
  if (3 < (uint)pLIRMIA3->leftthrusterchan) {
    puts("Invalid parameter : leftthrusterchan.");
    pLIRMIA3->leftthrusterchan = 0;
  }
  if (3 < (uint)pLIRMIA3->frontthrusterchan) {
    puts("Invalid parameter : frontthrusterchan.");
    pLIRMIA3->frontthrusterchan = 2;
  }
  if (3 < (uint)pLIRMIA3->rearthrusterchan) {
    puts("Invalid parameter : rearthrusterchan.");
    pLIRMIA3->rearthrusterchan = 3;
  }
  pLIRMIA3->LastPWs[0] = 0;
  pLIRMIA3->LastPWs[1] = 0;
  pLIRMIA3->LastPWs[2] = 0;
  pLIRMIA3->LastPWs[3] = 0;
  iVar4 = OpenRS232Port(&pLIRMIA3->RS232Port,pLIRMIA3->szDevPath);
  if (iVar4 != 0) {
    puts("Unable to connect to a LIRMIA3.");
    return 1;
  }
  iVar4 = (pLIRMIA3->RS232Port).DevType;
  if (3 < iVar4 - 1U) {
    if ((iVar4 != 0) ||
       (iVar4 = SetOptionsComputerRS232Port
                          ((pLIRMIA3->RS232Port).hDev,pLIRMIA3->BaudRate,'\0',0,'\b','\0',
                           pLIRMIA3->timeout), iVar4 != 0)) {
      pcVar6 = "Unable to connect to a LIRMIA3.";
      goto LAB_001c7275;
    }
    tcflush(*(int *)&(pLIRMIA3->RS232Port).hDev,2);
  }
  iVar4 = InitLIRMIA3(pLIRMIA3);
  if (iVar4 == 0) {
    puts("LIRMIA3 connected.");
    return 0;
  }
  pcVar6 = "Unable to connect to LIRMIA3 : Initialization failure.";
LAB_001c7275:
  puts(pcVar6);
  CloseRS232Port(&pLIRMIA3->RS232Port);
  return 1;
}

Assistant:

inline int ConnectLIRMIA3(LIRMIA3* pLIRMIA3, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	int channel = 0;

	memset(pLIRMIA3->szCfgFilePath, 0, sizeof(pLIRMIA3->szCfgFilePath));
	sprintf(pLIRMIA3->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pLIRMIA3->szDevPath, 0, sizeof(pLIRMIA3->szDevPath));
		sprintf(pLIRMIA3->szDevPath, "COM1");
		pLIRMIA3->BaudRate = 115200;
		pLIRMIA3->timeout = 1000;
		pLIRMIA3->threadperiod = 50;
		pLIRMIA3->bSaveRawData = 1;
		for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
		{
			pLIRMIA3->MinPWs[channel] = 1000;
			pLIRMIA3->MidPWs[channel] = 1500;
			pLIRMIA3->MaxPWs[channel] = 2000;
			pLIRMIA3->InitPWs[channel] = 1500;
			pLIRMIA3->ThresholdPWs[channel] = 0;
			pLIRMIA3->CoefPWs[channel] = 1;
			pLIRMIA3->bProportionalPWs[channel] = 1;
		}
		pLIRMIA3->rightthrusterchan = 3;
		pLIRMIA3->leftthrusterchan = 2;
		pLIRMIA3->frontthrusterchan = 0;
		pLIRMIA3->rearthrusterchan = 1;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pLIRMIA3->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->bSaveRawData) != 1) printf("Invalid configuration file.\n");

			for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
			{
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->MinPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->MidPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->MaxPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->InitPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->ThresholdPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pLIRMIA3->CoefPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pLIRMIA3->bProportionalPWs[channel]) != 1) printf("Invalid configuration file.\n");
			}

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->rightthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->leftthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->frontthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pLIRMIA3->rearthrusterchan) != 1) printf("Invalid configuration file.\n");

			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pLIRMIA3->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pLIRMIA3->threadperiod = 50;
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
	{
		if (
			(pLIRMIA3->MinPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3)||(pLIRMIA3->MinPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3)||
			(pLIRMIA3->MidPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3)||(pLIRMIA3->MidPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3)||
			(pLIRMIA3->MaxPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3)||(pLIRMIA3->MaxPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3)
			||(
			(pLIRMIA3->InitPWs[channel] != 0)&&
			((pLIRMIA3->InitPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3)||(pLIRMIA3->InitPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3)||
			(pLIRMIA3->MinPWs[channel] > pLIRMIA3->InitPWs[channel])||(pLIRMIA3->InitPWs[channel] > pLIRMIA3->MaxPWs[channel]))			
			)||
			(pLIRMIA3->MinPWs[channel] > pLIRMIA3->MidPWs[channel])||(pLIRMIA3->MidPWs[channel] > pLIRMIA3->MaxPWs[channel])||
			(pLIRMIA3->ThresholdPWs[channel] < 0)
			)
		{
			printf("Invalid parameters : channel %d.\n", channel);
			pLIRMIA3->MinPWs[channel] = 1000;
			pLIRMIA3->MidPWs[channel] = 1500;
			pLIRMIA3->MaxPWs[channel] = 2000;
			pLIRMIA3->InitPWs[channel] = 1500;
			pLIRMIA3->ThresholdPWs[channel] = 0;
			pLIRMIA3->CoefPWs[channel] = 1;
			pLIRMIA3->bProportionalPWs[channel] = 1;
		}
	}
	if ((pLIRMIA3->rightthrusterchan < 0)||(pLIRMIA3->rightthrusterchan >= NB_CHANNELS_PWM_LIRMIA3))
	{
		printf("Invalid parameter : rightthrusterchan.\n");
		pLIRMIA3->rightthrusterchan = 1;
	}
	if ((pLIRMIA3->leftthrusterchan < 0)||(pLIRMIA3->leftthrusterchan >= NB_CHANNELS_PWM_LIRMIA3))
	{
		printf("Invalid parameter : leftthrusterchan.\n");
		pLIRMIA3->leftthrusterchan = 0;
	}
	if ((pLIRMIA3->frontthrusterchan < 0)||(pLIRMIA3->frontthrusterchan >= NB_CHANNELS_PWM_LIRMIA3))
	{
		printf("Invalid parameter : frontthrusterchan.\n");
		pLIRMIA3->frontthrusterchan = 2;
	}
	if ((pLIRMIA3->rearthrusterchan < 0)||(pLIRMIA3->rearthrusterchan >= NB_CHANNELS_PWM_LIRMIA3))
	{
		printf("Invalid parameter : rearthrusterchan.\n");
		pLIRMIA3->rearthrusterchan = 3;
	}

	// Used to save raw data, should be handled specifically...
	//pLIRMIA3->pfSaveFile = NULL;

	for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
	{
		pLIRMIA3->LastPWs[channel] = 0;
	}

	if (OpenRS232Port(&pLIRMIA3->RS232Port, pLIRMIA3->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a LIRMIA3.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pLIRMIA3->RS232Port, pLIRMIA3->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pLIRMIA3->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a LIRMIA3.\n");
		CloseRS232Port(&pLIRMIA3->RS232Port);
		return EXIT_FAILURE;
	}

	if (InitLIRMIA3(pLIRMIA3) != EXIT_SUCCESS)
	{
		printf("Unable to connect to LIRMIA3 : Initialization failure.\n");
		CloseRS232Port(&pLIRMIA3->RS232Port);
		return EXIT_FAILURE;
	}

	printf("LIRMIA3 connected.\n");

	return EXIT_SUCCESS;
}